

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrRenderer.cpp
# Opt level: O1

void rr::anon_unknown_19::drawGeometryShaderOutputAsPrimitives<(rr::PrimitiveType)4>
               (RenderState *state,RenderTarget *renderTarget,Program *program,
               VertexPacket **vertices,size_t numVertices,VertexPacketAllocator *vpalloc)

{
  ProvokingVertex PVar1;
  VertexPacket *pVVar2;
  pointer pLVar3;
  size_t sVar4;
  size_type __n;
  VertexPacketAllocator *vpalloc_00;
  vector<rr::pa::Line,_std::allocator<rr::pa::Line>_> inputPrimitives;
  allocator_type local_49;
  vector<rr::pa::Line,_std::allocator<rr::pa::Line>_> local_48;
  
  __n = 0;
  if (1 < numVertices) {
    __n = numVertices - 1;
  }
  vpalloc_00 = (VertexPacketAllocator *)numVertices;
  std::vector<rr::pa::Line,_std::allocator<rr::pa::Line>_>::vector(&local_48,__n,&local_49);
  if (1 < numVertices) {
    PVar1 = state->provokingVertexConvention;
    sVar4 = 1;
    pLVar3 = local_48.super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      pVVar2 = (vertices + (sVar4 - 1))[1];
      pLVar3->v0 = vertices[sVar4 - 1];
      pLVar3->v1 = pVVar2;
      pLVar3->provokingIndex = (uint)(PVar1 != PROVOKINGVERTEX_FIRST);
      sVar4 = sVar4 + 1;
      pLVar3 = pLVar3 + 1;
    } while (numVertices != sVar4);
  }
  (anonymous_namespace)::
  makeSharedVerticesDistinct<std::vector<rr::pa::Line,std::allocator<rr::pa::Line>>>
            (&local_48,vpalloc);
  (anonymous_namespace)::drawBasicPrimitives<std::vector<rr::pa::Line,std::allocator<rr::pa::Line>>>
            (state,renderTarget,program,&local_48,vpalloc_00);
  if (local_48.super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void drawGeometryShaderOutputAsPrimitives (const RenderState& state, const RenderTarget& renderTarget, const Program& program, VertexPacket* const* vertices, size_t numVertices, VertexPacketAllocator& vpalloc)
{
	// Run primitive assembly for generated stream

	const size_t															assemblerPrimitiveCount		= PrimitiveTypeTraits<DrawPrimitiveType>::Assembler::getPrimitiveCount(numVertices);
	std::vector<typename PrimitiveTypeTraits<DrawPrimitiveType>::BaseType>	inputPrimitives				(assemblerPrimitiveCount);

	PrimitiveTypeTraits<DrawPrimitiveType>::Assembler::exec(inputPrimitives.begin(), vertices, numVertices, state.provokingVertexConvention); // \note input Primitives are baseType_t => only basic primitives (non adjacency) will compile

	// Make shared vertices distinct

	makeSharedVerticesDistinct(inputPrimitives, vpalloc);

	// Draw assembled primitives

	drawBasicPrimitives(state, renderTarget, program, inputPrimitives, vpalloc);
}